

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# test_section_fixups.cpp
# Opt level: O2

void __thiscall
ExternalFixupMembersImport_Name_Test::~ExternalFixupMembersImport_Name_Test
          (ExternalFixupMembersImport_Name_Test *this)

{
  anon_unknown.dwarf_38d868::ExternalFixupMembersImport::~ExternalFixupMembersImport
            (&this->super_ExternalFixupMembersImport);
  operator_delete(this,0x150);
  return;
}

Assistant:

TEST_F (ExternalFixupMembersImport, Name) {
    // Create matching names in the imported database.
    mock_mutex mutex;
    auto transaction = begin (db_, transaction_lock{mutex});

    pstore::exchange::import_ns::string_mapping imported_names;

    // The name key is missing altogether.
    {
        auto const & parser1 =
            this->parse (R"({ "type":13, "offset":19, "addend":23 })", &db_, imported_names);
        EXPECT_TRUE (parser1.has_error ()) << "Expected the parse to fail";
        EXPECT_EQ (
            parser1.last_error (),
            make_error_code (pstore::exchange::import_ns::error::xfixup_object_was_incomplete));
    }
    // The name key has the wrong type.
    {
        auto const & parser2 = this->parse (
            R"({ "name":"name", "type":13, "offset":19, "addend":23 })", &db_, imported_names);
        ASSERT_TRUE (parser2.has_error ()) << "Expected the parse to fail";
        EXPECT_EQ (parser2.last_error (),
                   make_error_code (pstore::exchange::import_ns::error::unexpected_string));
    }
    // The name key has a bad value.
    {
        auto const & parser3 = this->parse (R"({ "name":1, "type":13, "offset":19, "addend":23 })",
                                            &db_, imported_names);
        ASSERT_TRUE (parser3.has_error ()) << "Expected the parse to fail";
        EXPECT_EQ (parser3.last_error (),
                   make_error_code (pstore::exchange::import_ns::error::no_such_name));
    }
}